

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnStructType
          (BinaryReaderIR *this,Index index,Index field_count,TypeMut *fields)

{
  long lVar1;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var2;
  char *pcVar3;
  long lVar4;
  pointer *__ptr;
  bool *pbVar5;
  TypeModuleField *local_58;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_50;
  Location local_48;
  
  GetLocation(&local_48,this);
  MakeUnique<wabt::TypeModuleField,wabt::Location>((wabt *)&local_58,&local_48);
  MakeUnique<wabt::StructType>();
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::resize
            ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)
             ((long)local_48.filename.data_ + 0x50),(ulong)field_count);
  pcVar3 = local_48.filename.data_;
  pbVar5 = &fields->mutable_;
  for (lVar4 = 0; (ulong)field_count * 5 != lVar4; lVar4 = lVar4 + 5) {
    lVar1 = (long)((TypeEntry *)((long)local_48.filename.data_ + 0x50))->_vptr_TypeEntry;
    *(Enum *)(lVar1 + 0x20 + lVar4 * 8) = (((TypeMut *)(pbVar5 + -4))->type).enum_;
    *(bool *)(lVar1 + 0x24 + lVar4 * 8) = *pbVar5;
    pbVar5 = pbVar5 + 8;
  }
  local_48.filename.data_ = (char *)0x0;
  _Var2._M_head_impl =
       (local_58->type)._M_t.
       super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
       super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
       super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
  (local_58->type)._M_t.
  super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)pcVar3;
  local_50._M_head_impl = local_58;
  if (_Var2._M_head_impl != (TypeEntry *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TypeEntry + 8))();
    local_50._M_head_impl = local_58;
  }
  local_58 = (TypeModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_50);
  if (local_50._M_head_impl != (TypeModuleField *)0x0) {
    (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_50._M_head_impl = (TypeModuleField *)0x0;
  if ((long *)local_48.filename.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_48.filename.data_ + 8))();
  }
  if (local_58 != (TypeModuleField *)0x0) {
    (**(code **)(*(long *)local_58 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStructType(Index index,
                                    Index field_count,
                                    TypeMut* fields) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto struct_type = MakeUnique<StructType>();
  struct_type->fields.resize(field_count);
  for (Index i = 0; i < field_count; ++i) {
    struct_type->fields[i].type = fields[i].type;
    struct_type->fields[i].mutable_ = fields[i].mutable_;
  }
  field->type = std::move(struct_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}